

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stunmsgpp_unittest.cc
# Opt level: O0

void __thiscall
StunMsgCxx_BasicBindingRequest_Test::TestBody(StunMsgCxx_BasicBindingRequest_Test *this)

{
  bool bVar1;
  char *pcVar2;
  uint8_t *vec_b;
  char *in_R9;
  iterator iVar3;
  string local_160;
  AssertHelper local_140;
  Message local_138;
  decoded local_130;
  undefined1 local_120 [8];
  AssertionResult gtest_ar__1;
  iterator i;
  Message local_f8;
  uint16_t local_ee;
  type local_ec;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_b8;
  Message local_b0;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar_;
  AssertHelper local_90;
  Message local_88 [3];
  size_t local_70;
  unsigned_long local_68;
  undefined1 local_60 [8];
  AssertionResult gtest_ar;
  message message;
  uint8_t tsx_id [12];
  uint8_t expected_result [20];
  StunMsgCxx_BasicBindingRequest_Test *this_local;
  
  stack0xffffffffffffffd8 = 0x42a4122100000100;
  message.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x4528058a83e895fd;
  tsx_id[0] = 'j';
  tsx_id[1] = 0x8e;
  tsx_id[2] = 0xf1;
  tsx_id[3] = 0xe2;
  stun::base_message<std::allocator<unsigned_char>_>::base_message
            ((base_message<std::allocator<unsigned_char>_> *)&gtest_ar.message_,1,
             (uint8_t *)
             &message.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_68 = 0x14;
  local_70 = stun::base_message<std::allocator<unsigned_char>_>::size
                       ((base_message<std::allocator<unsigned_char>_> *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_60,"sizeof(expected_result)","message.size()",&local_68,
             &local_70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    testing::Message::Message(local_88);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_60);
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0x5b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_90,local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    testing::Message::~Message(local_88);
  }
  gtest_ar_.message_.ptr_._5_3_ = 0;
  gtest_ar_.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  if (gtest_ar_.message_.ptr_._4_4_ == 0) {
    vec_b = stun::base_message<std::allocator<unsigned_char>_>::data
                      ((base_message<std::allocator<unsigned_char>_> *)&gtest_ar.message_);
    anon_unknown.dwarf_f3ff::IsEqual((anon_unknown_dwarf_f3ff *)local_a8,tsx_id + 8,vec_b,0x14);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
    if (!bVar1) {
      testing::Message::Message(&local_b0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_1.message_,(internal *)local_a8,
                 (AssertionResult *)
                 "IsEqual(expected_result, message.data(), sizeof(expected_result))","false","true",
                 in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                 ,0x5d,pcVar2);
      testing::internal::AssertHelper::operator=(&local_b8,&local_b0);
      testing::internal::AssertHelper::~AssertHelper(&local_b8);
      std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_b0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
    local_ec = binding_request;
    local_ee = stun::base_message<std::allocator<unsigned_char>_>::type
                         ((base_message<std::allocator<unsigned_char>_> *)&gtest_ar.message_);
    testing::internal::EqHelper<false>::
    Compare<stun::base_message<std::allocator<unsigned_char>>::type,unsigned_short>
              ((EqHelper<false> *)local_e8,"stun::message::binding_request","message.type()",
               &local_ec,&local_ee);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
    if (!bVar1) {
      testing::Message::Message(&local_f8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&i.attr_.attr_hdr_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                 ,0x60,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&i.attr_.attr_hdr_,&local_f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i.attr_.attr_hdr_);
      testing::Message::~Message(&local_f8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
    iVar3 = stun::base_message<std::allocator<unsigned_char>_>::begin
                      ((base_message<std::allocator<unsigned_char>_> *)&gtest_ar.message_);
    i.attr_.msg_hdr_ = (stun_msg_hdr *)iVar3.attr_.attr_hdr_;
    gtest_ar__1.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)iVar3.attr_.msg_hdr_;
    local_130 = (decoded)stun::base_message<std::allocator<unsigned_char>_>::end
                                   ((base_message<std::allocator<unsigned_char>_> *)
                                    &gtest_ar.message_);
    bVar1 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator==
                      ((iterator *)&local_130,(self_type *)&gtest_ar__1.message_);
    testing::AssertionResult::AssertionResult((AssertionResult *)local_120,bVar1);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
    if (!bVar1) {
      testing::Message::Message(&local_138);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_160,(internal *)local_120,(AssertionResult *)"message.end() == i","false",
                 "true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_140,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                 ,99,pcVar2);
      testing::internal::AssertHelper::operator=(&local_140,&local_138);
      testing::internal::AssertHelper::~AssertHelper(&local_140);
      std::__cxx11::string::~string((string *)&local_160);
      testing::Message::~Message(&local_138);
    }
    gtest_ar_.message_.ptr_._5_3_ = 0;
    gtest_ar_.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
    if (gtest_ar_.message_.ptr_._4_4_ == 0) {
      gtest_ar_.message_.ptr_._4_4_ = 0;
    }
  }
  stun::base_message<std::allocator<unsigned_char>_>::~base_message
            ((base_message<std::allocator<unsigned_char>_> *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(StunMsgCxx, BasicBindingRequest) {
  const uint8_t expected_result[] = {
    0x00,0x01,0x00,0x00, //    Request type and message length
    0x21,0x12,0xa4,0x42, //    Magic cookie
    0xfd,0x95,0xe8,0x83, // }
    0x8a,0x05,0x28,0x45, // }  Transaction ID
    0x6a,0x8e,0xf1,0xe2  // }
  };
  
  uint8_t tsx_id[12] = {
    0xfd,0x95,0xe8,0x83,
    0x8a,0x05,0x28,0x45,
    0x6a,0x8e,0xf1,0xe2
  };

  stun::message message(stun::message::binding_request, tsx_id);
  ASSERT_EQ(sizeof(expected_result), message.size());
  EXPECT_TRUE(IsEqual(expected_result, message.data(),
      sizeof(expected_result)));

  // Now decoding
  EXPECT_EQ(stun::message::binding_request, message.type());

  stun::message::iterator i = message.begin();
  ASSERT_TRUE(message.end() == i);
}